

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_encoder.cc
# Opt level: O0

bool __thiscall
draco::MetadataEncoder::EncodeMetadata
          (MetadataEncoder *this,EncoderBuffer *out_buffer,Metadata *metadata)

{
  bool bVar1;
  Metadata *pMVar2;
  reference ppVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  MetadataEncoder *this_01;
  const_iterator out_buffer_00;
  const_iterator str;
  Metadata *in_RDX;
  MetadataEncoder *in_RSI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>
  *sub_metadata_entry;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
  *__range1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
  *sub_metadatas;
  uint32_t data_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *entry_value;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>
  *entry;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
  *entries;
  EncoderBuffer *in_stack_ffffffffffffff68;
  uint val;
  MetadataEncoder *in_stack_ffffffffffffff70;
  _Self in_stack_ffffffffffffff88;
  _Self in_stack_ffffffffffffff90;
  EncoderBuffer *in_stack_ffffffffffffff98;
  _Self local_40;
  _Self local_38;
  Metadata *local_30;
  
  pMVar2 = (Metadata *)Metadata::entries_abi_cxx11_(in_RDX);
  Metadata::num_entries((Metadata *)0x1c6392);
  local_30 = pMVar2;
  EncodeVarint<unsigned_int>((uint)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pMVar2 = local_30;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                *)in_stack_ffffffffffffff68);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
              *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      this_01 = (MetadataEncoder *)Metadata::sub_metadatas_abi_cxx11_(in_RDX);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
      ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
              *)0x1c649c);
      EncodeVarint<unsigned_int>((uint)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      out_buffer_00 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
                    *)in_stack_ffffffffffffff68);
      str = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
                   *)in_stack_ffffffffffffff68);
      while( true ) {
        bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff90,(_Self *)&stack0xffffffffffffff88)
        ;
        if (!bVar1) {
          return true;
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>
        ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>
                     *)in_stack_ffffffffffffff70);
        bVar1 = EncodeString(this_01,(EncoderBuffer *)out_buffer_00._M_node,(string *)str._M_node);
        if (!bVar1) break;
        std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>::get
                  ((unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *)
                   in_stack_ffffffffffffff70);
        EncodeMetadata(in_RSI,(EncoderBuffer *)in_RDX,pMVar2);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>
        ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>
                      *)in_stack_ffffffffffffff70);
      }
      return false;
    }
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>
                          *)in_stack_ffffffffffffff70);
    val = (uint)in_stack_ffffffffffffff70;
    bVar1 = EncodeString((MetadataEncoder *)in_stack_ffffffffffffff98,
                         (EncoderBuffer *)in_stack_ffffffffffffff90._M_node,
                         (string *)in_stack_ffffffffffffff88._M_node);
    if (!bVar1) break;
    this_00 = EntryValue::data(&ppVar3->second);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
    in_stack_ffffffffffffff70 = in_RSI;
    EncodeVarint<unsigned_int>(val,in_stack_ffffffffffffff68);
    in_RSI = in_stack_ffffffffffffff70;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c6461);
    EncoderBuffer::Encode
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90._M_node,
               (size_t)in_stack_ffffffffffffff88._M_node);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>
                  *)in_stack_ffffffffffffff70);
  }
  return false;
}

Assistant:

bool MetadataEncoder::EncodeMetadata(EncoderBuffer *out_buffer,
                                     const Metadata *metadata) {
  const std::map<std::string, EntryValue> &entries = metadata->entries();
  // Encode number of entries.
  EncodeVarint(static_cast<uint32_t>(metadata->num_entries()), out_buffer);
  // Encode all entries.
  for (const auto &entry : entries) {
    if (!EncodeString(out_buffer, entry.first)) {
      return false;
    }
    const std::vector<uint8_t> &entry_value = entry.second.data();
    const uint32_t data_size = static_cast<uint32_t>(entry_value.size());
    EncodeVarint(data_size, out_buffer);
    out_buffer->Encode(entry_value.data(), data_size);
  }
  const std::map<std::string, std::unique_ptr<Metadata>> &sub_metadatas =
      metadata->sub_metadatas();
  // Encode number of sub-metadata
  EncodeVarint(static_cast<uint32_t>(sub_metadatas.size()), out_buffer);
  // Encode each sub-metadata
  for (auto &&sub_metadata_entry : sub_metadatas) {
    if (!EncodeString(out_buffer, sub_metadata_entry.first)) {
      return false;
    }
    EncodeMetadata(out_buffer, sub_metadata_entry.second.get());
  }

  return true;
}